

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O2

TerminalInfo * __thiscall plot::TerminalInfo::detect<void>(TerminalInfo *this)

{
  Color *pCVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  detail *this_00;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  TerminalMode TVar9;
  char (*in_RCX) [6];
  char (*needle) [8];
  char (*needle_00) [7];
  string_view haystack;
  string_view haystack_00;
  string_view haystack_01;
  string_view haystack_02;
  string_view haystack_03;
  string_view haystack_04;
  string_view haystack_05;
  string_view haystack_06;
  string_view haystack_07;
  string_view haystack_08;
  string_view haystack_09;
  string_view haystack_10;
  string_view haystack_11;
  string_view cmd;
  string_view cmd_00;
  string_view terminator;
  string_view terminator_00;
  Color32 c;
  detail *local_78;
  TerminalMode local_6c;
  string response;
  Color local_40;
  
  bVar2 = is_terminal(this);
  if (!bVar2) {
    return this;
  }
  __s = getenv("TERM");
  if (__s == (char *)0x0) {
    this_00 = (detail *)0x0;
  }
  else {
    this_00 = (detail *)strlen(__s);
  }
  pcVar6 = getenv("COLORTERM");
  if (pcVar6 == (char *)0x0) {
    local_78 = (detail *)0x0;
  }
  else {
    local_78 = (detail *)strlen(pcVar6);
  }
  pcVar7 = getenv("VTE_VERSION");
  if (pcVar7 == (char *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = *pcVar7 == '\0';
  }
  haystack._M_str = "xterm";
  haystack._M_len = (size_t)__s;
  bVar3 = detail::contains<char_const(&)[6]>(this_00,haystack,in_RCX);
  needle = (char (*) [8])0x2;
  local_6c = Ansi;
  if (bVar2) {
    haystack_00._M_str = "truecolor";
    haystack_00._M_len = (size_t)pcVar6;
    bVar4 = detail::contains<char_const(&)[10]>(local_78,haystack_00,(char (*) [10])0x2);
    bVar2 = true;
    if (bVar4) {
      bVar4 = true;
      goto LAB_00106eff;
    }
    haystack_01._M_str = "cygwin";
    haystack_01._M_len = (size_t)__s;
    bVar2 = detail::contains<char_const(&)[7]>(this_00,haystack_01,(char (*) [7])needle);
    if (((bVar2) ||
        (haystack_02._M_str = "cygwin", haystack_02._M_len = (size_t)pcVar6,
        bVar2 = detail::contains<char_const(&)[7]>(local_78,haystack_02,(char (*) [7])needle), bVar2
        )) || (haystack_03._M_str = "konsole", haystack_03._M_len = (size_t)__s,
              bVar2 = detail::contains<char_const(&)[8]>(this_00,haystack_03,needle), bVar2)) {
      bVar4 = true;
      bVar2 = true;
      goto LAB_00106eff;
    }
    haystack_11._M_str = "konsole";
    haystack_11._M_len = (size_t)pcVar6;
    bVar2 = detail::contains<char_const(&)[8]>(local_78,haystack_11,needle);
    if (bVar2) goto LAB_00106dd0;
  }
  else if (('3' < *pcVar7) || ((*pcVar7 == '3' && ('5' < pcVar7[1])))) {
LAB_00106dd0:
    local_6c = Ansi;
    bVar2 = true;
    bVar4 = true;
    goto LAB_00106eff;
  }
  local_6c = Ansi;
  haystack_04._M_str = "256";
  haystack_04._M_len = (size_t)__s;
  pcVar6 = __s;
  bVar2 = detail::contains<char_const(&)[4]>(this_00,haystack_04,(char (*) [4])needle);
  if (bVar2) {
    bVar2 = true;
  }
  else {
    bVar2 = local_78 != (detail *)0x0;
    needle_00 = (char (*) [7])(CONCAT71((int7)((ulong)pcVar6 >> 8),bVar2 || bVar3) & 0xffffffff);
    if (bVar2 || bVar3) {
      bVar4 = false;
      goto LAB_00106eff;
    }
    haystack_05._M_str = "screen";
    haystack_05._M_len = (size_t)__s;
    bVar2 = detail::contains<char_const(&)[7]>(this_00,haystack_05,needle_00);
    if (((!bVar2) &&
        (haystack_06._M_str = "vt100", haystack_06._M_len = (size_t)__s,
        bVar2 = detail::contains<char_const(&)[6]>(this_00,haystack_06,(char (*) [6])needle_00),
        !bVar2)) &&
       ((haystack_07._M_str = "color", haystack_07._M_len = (size_t)__s,
        bVar2 = detail::contains<char_const(&)[6]>(this_00,haystack_07,(char (*) [6])needle_00),
        !bVar2 && ((haystack_08._M_str = "ansi", haystack_08._M_len = (size_t)__s,
                   bVar2 = detail::contains<char_const(&)[5]>
                                     (this_00,haystack_08,(char (*) [5])needle_00), !bVar2 &&
                   (haystack_09._M_str = "cygwin", haystack_09._M_len = (size_t)__s,
                   bVar2 = detail::contains<char_const(&)[7]>(this_00,haystack_09,needle_00), !bVar2
                   )))))) {
      haystack_10._M_str = "linux";
      haystack_10._M_len = (size_t)__s;
      bVar2 = detail::contains<char_const(&)[6]>(this_00,haystack_10,(char (*) [6])needle_00);
      local_6c = (uint)bVar2 * 2;
    }
    bVar2 = false;
  }
  bVar4 = false;
LAB_00106eff:
  if (this->mode == None) {
    if (bVar2) {
      local_6c = Ansi256;
    }
    TVar9 = Iso24bit;
    if (!bVar4) {
      TVar9 = local_6c;
    }
    this->mode = TVar9;
  }
  if (bVar3) {
    pCVar1 = &this->foreground_color;
    response._M_dataplus._M_p = (pointer)0x3f6666663f666666;
    response._M_string_length = 0x3f8000003f666666;
    bVar2 = Color::operator==(pCVar1,(Color *)&response);
    if (bVar2) {
      cmd._M_str = "\x1b]10;?\x1b\\";
      cmd._M_len = 8;
      terminator._M_str = "\a\\";
      terminator._M_len = 2;
      query<void>(&response,this,cmd,terminator);
      if ((response._M_string_length != 0) &&
         (lVar8 = std::__cxx11::string::find((char *)&response,0x10d45d), lVar8 != -1)) {
        c.r = 0xff;
        c.g = 0xff;
        c.b = 0xff;
        c.a = 0xff;
        iVar5 = __isoc99_sscanf(response._M_dataplus._M_p + lVar8 + 4,
                                "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&c,&c.g,&c.b);
        if (iVar5 == 3) {
          Color::Color(&local_40,c,0xff,0xff);
          pCVar1->r = local_40.r;
          pCVar1->g = local_40.g;
          (this->foreground_color).b = local_40.b;
          (this->foreground_color).a = local_40.a;
        }
      }
      std::__cxx11::string::~string((string *)&response);
    }
    pCVar1 = &this->background_color;
    response._M_dataplus._M_p = (pointer)0x0;
    response._M_string_length = 0x3f80000000000000;
    bVar2 = Color::operator==(pCVar1,(Color *)&response);
    if (bVar2) {
      cmd_00._M_str = "\x1b]11;?\x1b\\";
      cmd_00._M_len = 8;
      terminator_00._M_str = "\a\\";
      terminator_00._M_len = 2;
      query<void>(&response,this,cmd_00,terminator_00);
      if ((response._M_string_length != 0) &&
         (lVar8 = std::__cxx11::string::find((char *)&response,0x10d45d), lVar8 != -1)) {
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = 0xff;
        iVar5 = __isoc99_sscanf(response._M_dataplus._M_p + lVar8 + 4,
                                "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&c,&c.g,&c.b);
        if (iVar5 == 3) {
          Color::Color(&local_40,c,0xff,0xff);
          pCVar1->r = local_40.r;
          pCVar1->g = local_40.g;
          (this->background_color).b = local_40.b;
          (this->background_color).a = local_40.a;
        }
      }
      std::__cxx11::string::~string((string *)&response);
    }
  }
  return this;
}

Assistant:

TerminalInfo& TerminalInfo::detect() {
    if (!is_terminal())
        return *this;

    string_view name, colorterm, vte_version;

    auto tmp = std::getenv(u8"TERM");
    if (tmp) name = tmp;

    tmp = std::getenv(u8"COLORTERM");
    if (tmp) colorterm = tmp;

    tmp = std::getenv(u8"VTE_VERSION");
    if (tmp) vte_version = tmp;

    bool xterm_like = detail::contains(name, u8"xterm");

    bool has_truecolor =
        !vte_version.empty()
            ? (vte_version[0] > '3' || (vte_version[0] == '3' && vte_version[1] >= '6')) // VTE >= 0.36 supports true color
            : detail::contains(colorterm, u8"truecolor") ||
              detail::contains(name, u8"cygwin") ||
              detail::contains(colorterm, u8"cygwin") ||
              detail::contains(name, u8"konsole") ||
              detail::contains(colorterm, u8"konsole");

    bool has_256color = has_truecolor ||
                        detail::contains(name, u8"256") ||
                        !colorterm.empty();

    bool has_ansi = has_256color ||
                    xterm_like ||
                    detail::contains(name, u8"screen") ||
                    detail::contains(name, u8"vt100") ||
                    detail::contains(name, u8"color") ||
                    detail::contains(name, u8"ansi") ||
                    detail::contains(name, u8"cygwin") ||
                    detail::contains(name, u8"linux");

    if (mode == TerminalMode::None)
        mode = has_truecolor ? TerminalMode::Iso24bit
                             : has_256color ? TerminalMode::Ansi256
                                            : has_ansi ? TerminalMode::Ansi
                                                       : TerminalMode::None;

    if (xterm_like && foreground_color == Color(0.9f, 0.9f, 0.9f, 1)) {
        auto response = query(u8"\x1b]10;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 255, 255, 255, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    foreground_color = c;
            }
        }
    }

    if (xterm_like && background_color == Color(0, 0, 0, 1)) {
        auto response = query(u8"\x1b]11;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 0, 0, 0, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    background_color = c;
            }
        }
    }

    return *this;
}